

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O0

void __thiscall mbc::Val::MessageBook::save(MessageBook *this)

{
  int iVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  undefined4 extraout_var;
  Ch *pCVar2;
  ostream local_2a0 [8];
  ofstream out;
  shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_a0 [2];
  undefined1 local_80 [8];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  MessageBook *this_local;
  
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x100);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *)local_80,
           (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
           &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x20);
  (*(this->super_ValBase)._vptr_ValBase[2])(local_a0);
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)std::
               __shared_ptr_access<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (this_00,(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)local_80);
  std::
  shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~shared_ptr(local_a0);
  iVar1 = (*(this->path_->super__ValAtom).super_ValBase._vptr_ValBase[4])();
  std::ofstream::ofstream(local_2a0,(string *)CONCAT44(extraout_var,iVar1),_S_out);
  pCVar2 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.maxDecimalPlaces_);
  std::operator<<(local_2a0,pCVar2);
  std::ofstream::~ofstream(local_2a0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)local_80);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             &writer.maxDecimalPlaces_);
  return;
}

Assistant:

void MessageBook::save() {
    StringBuffer buffer;
    Writer<StringBuffer> writer(buffer);
    json_value() -> Accept(writer);

    ofstream out(path_ -> raw());
    out << buffer.GetString();
}